

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O0

pcp_errno parse_v1_peer(pcp_recv_msg_t *f,void *r)

{
  ulong uVar1;
  size_t rest_size;
  pcp_peer_v1_t *m;
  void *r_local;
  pcp_recv_msg_t *f_local;
  
  uVar1 = (ulong)f->pcp_msg_len - ((long)r - (long)f->pcp_msg_buffer);
  if (uVar1 < 0x2c) {
    f_local._4_4_ = PCP_ERR_RECV_FAILED;
  }
  else {
    (f->kd).field_5.map_peer.src_port = *(uint16_t *)((long)r + 4);
    (f->kd).field_5.map_peer.protocol = *r;
    (f->kd).field_5.map_peer.dst_port = *(uint16_t *)((long)r + 0x18);
    f->assigned_ext_port = *(uint16_t *)((long)r + 6);
    *(undefined8 *)((long)&(f->kd).field_5 + 4) = *(undefined8 *)((long)r + 0x1c);
    *(undefined8 *)((long)&(f->kd).field_5 + 0xc) = *(undefined8 *)((long)r + 0x24);
    *(undefined8 *)&(f->assigned_ext_ip).__in6_u = *(undefined8 *)((long)r + 8);
    *(undefined8 *)((long)&(f->assigned_ext_ip).__in6_u + 8) = *(undefined8 *)((long)r + 0x10);
    if (uVar1 < 0x2d) {
      f_local._4_4_ = PCP_ERR_SUCCESS;
    }
    else {
      f_local._4_4_ = parse_options(f,(void *)((long)r + 0x2c));
    }
  }
  return f_local._4_4_;
}

Assistant:

static pcp_errno parse_v1_peer(pcp_recv_msg_t *f, void *r) {
    pcp_peer_v1_t *m;
    size_t rest_size = f->pcp_msg_len - (((char *)r) - f->pcp_msg_buffer);

    if (rest_size < sizeof(pcp_peer_v1_t)) {
        return PCP_ERR_RECV_FAILED;
    }

    m = (pcp_peer_v1_t *)r;
    f->kd.map_peer.src_port = m->int_port;
    f->kd.map_peer.protocol = m->protocol;
    f->kd.map_peer.dst_port = m->peer_port;
    f->assigned_ext_port = m->ext_port;
    memcpy(&f->kd.map_peer.dst_ip, m->peer_ip, sizeof(f->kd.map_peer.dst_ip));
    memcpy(&f->assigned_ext_ip, m->ext_ip, sizeof(f->assigned_ext_ip));

    if (rest_size > sizeof(pcp_peer_v1_t)) {
        return parse_options(f, m + 1);
    }
    return PCP_ERR_SUCCESS;
}